

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateModelDescription
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion)

{
  validateFeatureDescriptions(__return_storage_ptr__,interface,modelVersion);
  Result::good(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateModelDescription(const Specification::ModelDescription& interface, int modelVersion) {

        Result result = validateFeatureDescriptions(interface, modelVersion);
        if (!result.good()) {
            return result;
        }

        return result;

    }